

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O3

void __thiscall
burst::detail::
join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::join_iterator_impl
          (join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this,outer_range_iterator first,outer_range_iterator last)

{
  int *piVar1;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  *piVar2;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar3;
  uint uVar4;
  outer_range_iterator oVar5;
  
  (this->m_begin)._M_current = first._M_current;
  (this->m_end)._M_current = last._M_current;
  if (first._M_current == last._M_current) {
    (this->m_outer)._M_current =
         (iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *)0x0;
    (this->m_inner)._M_current = (int *)0x0;
    this->m_items_remaining = 0;
    return;
  }
  (this->m_outer)._M_current = first._M_current;
  piVar1 = ((first._M_current)->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
  (this->m_inner)._M_current = piVar1;
  uVar4 = 0;
  oVar5._M_current = first._M_current;
  do {
    uVar4 = uVar4 + (int)((ulong)((long)((oVar5._M_current)->
                                        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                                        ).
                                        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                                        .
                                        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                                        .m_End._M_current -
                                 (long)((oVar5._M_current)->
                                       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                                       ).
                                       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                                       .
                                       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                                       .m_Begin._M_current) >> 2);
    oVar5._M_current = oVar5._M_current + 1;
  } while (oVar5._M_current != last._M_current);
  this->m_items_remaining = (ulong)uVar4;
  if (piVar1 == ((first._M_current)->
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                ).
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                .m_End._M_current) {
    piVar3 = first._M_current + 1;
    do {
      (this->m_outer)._M_current = piVar3;
      if (piVar3 == last._M_current) {
        return;
      }
      piVar1 = (piVar3->
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current;
      (this->m_inner)._M_current = piVar1;
      piVar2 = &piVar3->
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
      ;
      piVar3 = piVar3 + 1;
    } while (piVar1 == (piVar2->
                       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                       ).
                       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                       .m_End._M_current);
  }
  return;
}

Assistant:

explicit join_iterator_impl (outer_range_iterator first, outer_range_iterator last):
                m_begin(std::move(first)),
                m_end(std::move(last)),
                m_outer(m_begin != m_end ? m_begin : outer_range_iterator{}),
                m_inner(m_begin != m_end ? m_outer->begin() : inner_range_iterator{}),
                m_items_remaining{}
            {
                if (m_begin != m_end)
                {
                    m_items_remaining =
                        std::accumulate(m_begin, m_end, 0u,
                            [] (auto v, const auto & r)
                            {
                                return v + r.size();
                            });

                    maintain_invariant();
                }
            }